

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitPow2
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,UnaryExpr e)

{
  ulong uVar1;
  Buffer<char> *pBVar2;
  size_t sVar3;
  
  Visit(this,(NumericExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_ +
             8))->impl_,0xc);
  pBVar2 = this->writer_->buffer_;
  sVar3 = pBVar2->size_;
  uVar1 = sVar3 + 4;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar3 = pBVar2->size_;
  }
  builtin_strncpy(pBVar2->ptr_ + sVar3," ^ 2",4);
  pBVar2->size_ = uVar1;
  return;
}

Assistant:

void VisitPow2(UnaryExpr e) {
    Visit(e.arg(), prec::EXPONENTIATION + 1);
    writer_ << " ^ 2";
  }